

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O1

void Bmc_BmciUnfold(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vFFLits,int fPiReuse)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  
  uVar4 = p->nRegs;
  uVar3 = vFFLits->nSize;
  if (uVar4 != uVar3) {
    __assert_fail("Gia_ManRegNum(p) == Vec_IntSize(vFFLits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0x5f,"void Bmc_BmciUnfold(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
  }
  pGVar1 = p->pObjs;
  pGVar1->Value = 0;
  if (0 < (int)uVar4) {
    pVVar9 = p->vCis;
    iVar5 = pVVar9->nSize;
    uVar8 = (ulong)(iVar5 - uVar4);
    uVar12 = 0;
    uVar13 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar13 = uVar12;
    }
    do {
      if (((int)uVar8 < 0) || (iVar5 <= (int)uVar8)) goto LAB_00568455;
      iVar7 = pVVar9->pArray[uVar8];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00568436;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      bVar16 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar16) goto LAB_00568455;
      pGVar1[iVar7].Value = vFFLits->pArray[uVar12];
      uVar12 = uVar12 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar12);
  }
  pVVar9 = p->vCis;
  uVar4 = pVVar9->nSize;
  uVar8 = (ulong)uVar4;
  uVar3 = uVar4 - p->nRegs;
  uVar13 = (ulong)uVar3;
  if (uVar3 != 0 && p->nRegs <= (int)uVar4) {
    lVar15 = 0;
    do {
      if ((int)uVar8 <= lVar15) goto LAB_00568455;
      iVar5 = pVVar9->pArray[lVar15];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00568436;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (fPiReuse == 0) {
        pGVar10 = Gia_ManAppendObj(pNew);
        uVar13 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar13 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = pNew->pObjs;
        if ((pGVar10 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar10)) {
LAB_00568474:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pNew->pObjs;
        if ((pGVar10 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar10)) goto LAB_00568474;
        uVar4 = (int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2) * 0x55555556;
      }
      else {
        iVar7 = pNew->vCis->nSize;
        iVar11 = iVar7 - pNew->nRegs;
        uVar13 = (ulong)(uint)(iVar11 - (int)uVar13) + lVar15;
        iVar6 = (int)uVar13;
        if (iVar11 <= iVar6) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        if ((iVar6 < 0) || (iVar7 <= iVar6)) goto LAB_00568455;
        iVar7 = pNew->vCis->pArray[uVar13 & 0xffffffff];
        if (((long)iVar7 < 0) || (pNew->nObjs <= iVar7)) goto LAB_00568436;
        pGVar2 = pNew->pObjs;
        pGVar10 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar7) & 0xfffffffffffffffe);
        if ((pGVar10 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar10)) goto LAB_00568474;
        iVar6 = (int)((ulong)((long)pGVar10 - (long)pGVar2) >> 2);
        if (iVar6 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar4 = ((uint)(pGVar2 + iVar7) & 1) + iVar6 * 0x55555556;
      }
      pGVar1[iVar5].Value = uVar4;
      lVar15 = lVar15 + 1;
      pVVar9 = p->vCis;
      uVar8 = (ulong)pVVar9->nSize;
      uVar13 = uVar8 - (long)p->nRegs;
    } while (lVar15 < (long)uVar13);
  }
  if (0 < p->nObjs) {
    lVar15 = 8;
    lVar14 = 0;
    while (pGVar1 = p->pObjs, pGVar1 != (Gia_Obj_t *)0x0) {
      uVar13 = *(ulong *)((long)pGVar1 + lVar15 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar4 = *(uint *)((long)pGVar1 +
                         lVar15 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar4 < 0) ||
           (uVar3 = *(uint *)((long)pGVar1 +
                             lVar15 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar3 < 0)) goto LAB_00568493;
        iVar5 = Gia_ManHashAnd(pNew,uVar4 ^ (uint)(uVar13 >> 0x1d) & 1,
                               uVar3 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar1->field_0x0 + lVar15) = iVar5;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
      if (p->nObjs <= lVar14) break;
    }
  }
  uVar13 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    pVVar9 = p->vCos;
    lVar15 = 0;
    do {
      iVar5 = pVVar9->nSize;
      uVar13 = (ulong)(uint)(iVar5 - (int)uVar13) + lVar15;
      iVar7 = (int)uVar13;
      if ((iVar7 < 0) || (iVar5 <= iVar7)) {
LAB_00568455:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = pVVar9->pArray[uVar13 & 0xffffffff];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_00568436:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar5;
      uVar3 = (uint)*(undefined8 *)pGVar1;
      uVar4 = pGVar1[-(ulong)(uVar3 & 0x1fffffff)].Value;
      if ((int)uVar4 < 0) {
LAB_00568493:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      if (vFFLits->nSize <= lVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vFFLits->pArray[lVar15] = uVar3 >> 0x1d & 1 ^ uVar4;
      lVar15 = lVar15 + 1;
      uVar13 = (ulong)p->nRegs;
    } while (lVar15 < (long)uVar13);
  }
  return;
}

Assistant:

void Bmc_BmciUnfold( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vFFLits, int fPiReuse )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == Vec_IntSize(vFFLits) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Vec_IntEntry(vFFLits, i);
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = fPiReuse ? Gia_ObjToLit(pNew, Gia_ManPi(pNew, Gia_ManPiNum(pNew)-Gia_ManPiNum(p)+i)) : Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntWriteEntry( vFFLits, i, Gia_ObjFanin0Copy(pObj) );
}